

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O0

sc_uint_base * __thiscall sc_dt::sc_uint_base::operator=(sc_uint_base *this,sc_bv_base *a)

{
  value_type v;
  sc_bv_base *in_RSI;
  sc_uint_base *in_RDI;
  int i;
  int minlen;
  int local_1c;
  int local_18;
  int local_14;
  sc_bv_base *local_10;
  
  local_10 = in_RSI;
  local_18 = sc_bv_base::length(in_RSI);
  local_14 = sc_min<int>(&in_RDI->m_len,&local_18);
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    v = sc_bv_base::get_bit(local_10,local_1c);
    set(in_RDI,local_1c,v);
  }
  for (; local_1c < in_RDI->m_len; local_1c = local_1c + 1) {
    set(in_RDI,local_1c,false);
  }
  extend_sign(in_RDI);
  return in_RDI;
}

Assistant:

sc_uint_base&
sc_uint_base::operator = ( const sc_bv_base& a )
{
    int minlen = sc_min( m_len, a.length() );
    int i = 0;
    for( ; i < minlen; ++ i ) {
	set( i, a.get_bit( i ) );
    }
    for( ; i < m_len; ++ i ) {
	// zero extension
	set( i, 0 );
    }
    extend_sign();
    return *this;
}